

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v7::detail::format_value<char,diy::DynamicPoint<float,4ul>>
               (buffer<char> *buf,DynamicPoint<float,_4UL> *value,locale_ref loc)

{
  locale_ref lStack_198;
  locale local_190 [8];
  locale_ref loc_local;
  formatbuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  ios_base local_130 [264];
  
  loc_local = loc;
  formatbuf<char>::formatbuf(&format_buf,buf);
  std::ostream::ostream(&output,(streambuf *)&format_buf);
  if (loc.locale_ != (void *)0x0) {
    locale_ref::get<std::locale>(&lStack_198);
    std::ios::imbue(local_190);
    std::locale::~locale(local_190);
    std::locale::~locale((locale *)&lStack_198);
  }
  diy::DynamicPoint<float,_4UL>::operator<<(value,&output);
  std::ios::exceptions((int)&output + (int)*(undefined8 *)(_output + -0x18));
  buffer<char>::try_resize(buf,buf->size_);
  std::ios_base::~ios_base(local_130);
  std::streambuf::~streambuf((streambuf *)&format_buf);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
#if !defined(FMT_STATIC_THOUSANDS_SEPARATOR)
  if (loc) output.imbue(loc.get<std::locale>());
#endif
  output << value;
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  buf.try_resize(buf.size());
}